

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
               (string *s,char *fmt,Normal3<float> *v,Normal3<float> *args,char **args_1,
               char **args_2,Vector3<float> *args_3,Vector3<float> *args_4,float *args_5,
               float *args_6,float *args_7,float *args_8,int *args_9)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char **v_00;
  ulong uVar4;
  char *in_RCX;
  string *in_RDX;
  string *in_RDI;
  Normal3<float> *in_R8;
  char **in_R9;
  Vector3<float> *unaff_R14;
  float *unaff_R15;
  float *unaff_retaddr;
  float *in_stack_00000008;
  float *in_stack_00000010;
  int *in_stack_00000018;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  Normal3<float> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd70;
  char **in_stack_fffffffffffffd78;
  Normal3<float> *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  string local_258 [32];
  undefined8 local_238;
  string local_230 [24];
  char *in_stack_fffffffffffffde8;
  stringstream local_210 [4];
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  string local_70 [16];
  Vector3<float> *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar1 = std::__cxx11::string::find((char)local_70,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_70,0x73);
  lVar3 = std::__cxx11::string::find((char)local_70,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::Normal3<float>const&>(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_210);
    pbrt::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    v_00 = (char **)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_238 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffd88,v_00);
    std::__cxx11::string::operator+=(in_RDI,local_230);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::stringstream::~stringstream(local_210);
  }
  stringPrintfRecursive<pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,unaff_R14
             ,unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}